

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::reformat(QStatusBar *this)

{
  bool bVar1;
  int iVar2;
  QStatusBarPrivate *pQVar3;
  QBoxLayout *pQVar4;
  QMargins *pQVar5;
  qsizetype qVar6;
  const_reference pSVar7;
  int *piVar8;
  long in_FS_OFFSET;
  SBItem *item_1;
  SBItem *item;
  qsizetype i;
  QBoxLayout *l;
  QBoxLayout *vbox;
  QStatusBarPrivate *d;
  int itemH_1;
  int itemH;
  int maxH;
  QWidget *in_stack_fffffffffffffeb8;
  QWidget *in_stack_fffffffffffffec0;
  QMargins *in_stack_fffffffffffffec8;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QLayout *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  QLayout *in_stack_ffffffffffffff30;
  QBoxLayout *local_a0;
  int local_6c;
  int local_68;
  QSize local_64;
  int local_5c;
  int local_58;
  undefined1 local_54 [4];
  int local_50;
  QSize local_4c;
  int local_44;
  int local_40;
  undefined1 local_3c [4];
  QFontMetrics local_38 [12];
  int local_2c [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QStatusBar *)0x6a3409);
  if ((pQVar3->box != (QBoxLayout *)0x0) && (pQVar3->box != (QBoxLayout *)0x0)) {
    (**(code **)(*(long *)&pQVar3->box->super_QLayout + 0x20))();
  }
  if (pQVar3->resizer == (QSizeGrip *)0x0) {
    pQVar4 = (QBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pQVar3->box = pQVar4;
    QMargins::QMargins((QMargins *)in_stack_fffffffffffffec0);
    QLayout::setContentsMargins(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    pQVar4 = (QBoxLayout *)operator_new(0x20);
    QHBoxLayout::QHBoxLayout((QHBoxLayout *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pQVar3->box = pQVar4;
    in_stack_ffffffffffffff30 = &pQVar3->box->super_QLayout;
    QMargins::QMargins((QMargins *)in_stack_fffffffffffffec0);
    QLayout::setContentsMargins(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_stack_fffffffffffffec0);
    QBoxLayout::addLayout
              ((QBoxLayout *)in_stack_fffffffffffffec0,(QLayout *)in_stack_fffffffffffffeb8,0);
  }
  QBoxLayout::addSpacing
            ((QBoxLayout *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
            );
  pQVar5 = (QMargins *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)in_stack_fffffffffffffec0);
  QBoxLayout::addLayout
            ((QBoxLayout *)in_stack_fffffffffffffec0,(QLayout *)in_stack_fffffffffffffeb8,0);
  QBoxLayout::addSpacing
            ((QBoxLayout *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
            );
  (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,6);
  QWidget::fontMetrics(in_stack_fffffffffffffeb8);
  iVar2 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics(local_38);
  local_2c[0] = iVar2;
  for (local_a0 = (QBoxLayout *)0x0; qVar6 = QList<QStatusBarPrivate::SBItem>::size(&pQVar3->items),
      (long)local_a0 < qVar6; local_a0 = (QBoxLayout *)&(local_a0->super_QLayout).field_0x1) {
    pSVar7 = QList<QStatusBarPrivate::SBItem>::at
                       ((QList<QStatusBarPrivate::SBItem> *)in_stack_fffffffffffffec0,
                        (qsizetype)in_stack_fffffffffffffeb8);
    bVar1 = QStatusBarPrivate::SBItem::isPermanent(pSVar7);
    if (bVar1) break;
    memset(local_3c,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x6a3731);
    QBoxLayout::addWidget
              ((QBoxLayout *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffec8 >> 0x20,0));
    local_4c = qSmartMinSize(in_stack_fffffffffffffeb8);
    local_44 = QSize::height((QSize *)0x6a3770);
    local_50 = QWidget::maximumHeight(in_stack_fffffffffffffec0);
    piVar8 = qMin<int>(&local_44,&local_50);
    local_40 = *piVar8;
    piVar8 = qMax<int>(local_2c,&local_40);
    local_2c[0] = *piVar8;
  }
  QBoxLayout::addStretch
            ((QBoxLayout *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
            );
  while( true ) {
    alignment.i = (Int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    pQVar4 = local_a0;
    qVar6 = QList<QStatusBarPrivate::SBItem>::size(&pQVar3->items);
    if (qVar6 <= (long)pQVar4) break;
    pSVar7 = QList<QStatusBarPrivate::SBItem>::at
                       ((QList<QStatusBarPrivate::SBItem> *)in_stack_fffffffffffffec0,
                        (qsizetype)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffedc = pSVar7->stretch;
    in_stack_fffffffffffffec8 = pQVar5;
    memset(local_54,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x6a38a7);
    QBoxLayout::addWidget
              ((QBoxLayout *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffec8 >> 0x20,0));
    local_64 = qSmartMinSize(in_stack_fffffffffffffeb8);
    local_5c = QSize::height((QSize *)0x6a38e6);
    local_68 = QWidget::maximumHeight(in_stack_fffffffffffffec0);
    piVar8 = qMin<int>(&local_5c,&local_68);
    local_58 = *piVar8;
    piVar8 = qMax<int>(local_2c,&local_58);
    local_2c[0] = *piVar8;
    local_a0 = (QBoxLayout *)&(local_a0->super_QLayout).field_0x1;
  }
  if (pQVar3->resizer != (QSizeGrip *)0x0) {
    (**(code **)(*(long *)&pQVar3->resizer->super_QWidget + 0x70))();
    iVar2 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    local_6c = QSize::height((QSize *)0x6a3999);
    piVar8 = qMax<int>(local_2c,&local_6c);
    local_2c[0] = *piVar8;
    QBoxLayout::addSpacing((QBoxLayout *)in_stack_fffffffffffffec0,iVar2);
    in_stack_fffffffffffffeb8 = (QWidget *)pQVar3->box;
    in_stack_fffffffffffffec0 = &pQVar3->resizer->super_QWidget;
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,
               (AlignmentFlag)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    QBoxLayout::addWidget
              ((QBoxLayout *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0,
               (Alignment)alignment.i);
  }
  QBoxLayout::addStrut(pQVar4,in_stack_fffffffffffffedc);
  pQVar3->savedStrut = local_2c[0];
  QBoxLayout::addSpacing
            ((QBoxLayout *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
            );
  QLayout::activate(in_stack_ffffffffffffff30);
  QWidget::update(in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStatusBar::reformat()
{
    Q_D(QStatusBar);
    if (d->box)
        delete d->box;

    QBoxLayout *vbox;
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        d->box = new QHBoxLayout(this);
        d->box->setContentsMargins(QMargins());
        vbox = new QVBoxLayout;
        d->box->addLayout(vbox);
    } else
#endif
    {
        vbox = d->box = new QVBoxLayout(this);
        d->box->setContentsMargins(QMargins());
    }
    vbox->addSpacing(3);
    QBoxLayout* l = new QHBoxLayout;
    vbox->addLayout(l);
    l->addSpacing(2);
    l->setSpacing(6);

    int maxH = fontMetrics().height();

    qsizetype i;
    for (i = 0; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        if (item.isPermanent())
            break;
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }

    l->addStretch(0);

    for (; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        maxH = qMax(maxH, d->resizer->sizeHint().height());
        d->box->addSpacing(1);
        d->box->addWidget(d->resizer, 0, Qt::AlignBottom);
    }
#endif
    l->addStrut(maxH);
    d->savedStrut = maxH;
    vbox->addSpacing(2);
    d->box->activate();
    update();
}